

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_75(QPDF *pdf,char *arg2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  long *plVar6;
  long lVar7;
  undefined1 in_R8B;
  QPDFObjectHandle QVar8;
  QPDFObjectHandle QVar9;
  QPDFObjectHandle QVar10;
  QPDFObjectHandle QVar11;
  QPDFNumberTreeObjectHelper erase3;
  QPDFNumberTreeObjectHelper erase4;
  QPDFObjectHandle k1;
  QPDFWriter w;
  QPDFObjectHandle l1;
  iterator iter1;
  QPDFObjectHandle erase2_oh;
  QPDFNumberTreeObjectHelper erase2;
  QPDFObjectHandle value;
  iterator iter2;
  QPDFNameTreeObjectHelper erase1;
  iterator local_260;
  iterator local_228;
  _func_int **local_1e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1e0;
  iterator local_1d8;
  _func_int **local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1a0;
  undefined1 local_198 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  undefined8 local_150;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_148;
  iterator local_140;
  undefined8 local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_f0;
  iterator local_e0;
  undefined8 local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  string local_90 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  string local_80 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  string local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  QPDFNameTreeObjectHelper local_60 [56];
  
  QPDF::getTrailer();
  local_198._0_8_ = (element_type *)&local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"/Erase1","");
  QPDFObjectHandle::getKey(local_70);
  QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_70;
  QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper(local_60,QVar8,(QPDF *)0x1,(bool)in_R8B);
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if ((element_type *)local_198._0_8_ != (element_type *)&local_188) {
    operator_delete((void *)local_198._0_8_,
                    (ulong)((long)&(local_188._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_140.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_140.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  local_f8 = 0;
  p_Stack_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_198._0_8_ = (element_type *)&local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"1X","");
  cVar3 = QPDFNameTreeObjectHelper::remove((string *)local_60,(QPDFObjectHandle *)local_198);
  if (cVar3 != '\0') {
    __assert_fail("!erase1.remove(\"1X\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa0c,"void test_75(QPDF &, const char *)");
  }
  if ((element_type *)local_198._0_8_ != (element_type *)&local_188) {
    operator_delete((void *)local_198._0_8_,
                    (ulong)((long)&(local_188._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_198._0_8_ = (element_type *)&local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"1C","");
  cVar3 = QPDFNameTreeObjectHelper::remove((string *)local_60,(QPDFObjectHandle *)local_198);
  if (cVar3 == '\0') {
    __assert_fail("erase1.remove(\"1C\", &value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa0d,"void test_75(QPDF &, const char *)");
  }
  if ((element_type *)local_198._0_8_ != (element_type *)&local_188) {
    operator_delete((void *)local_198._0_8_,
                    (ulong)((long)&(local_188._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::getUTF8Value_abi_cxx11_();
  iVar4 = std::__cxx11::string::compare(local_198);
  if (iVar4 != 0) {
    __assert_fail("value.getUTF8Value() == \"c\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa0e,"void test_75(QPDF &, const char *)");
  }
  if ((element_type *)local_198._0_8_ != (element_type *)&local_188) {
    operator_delete((void *)local_198._0_8_,
                    (ulong)((long)&(local_188._M_pi)->_vptr__Sp_counted_base + 1));
  }
  p_Var1 = &local_140.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  local_140._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"1B","");
  QPDFNameTreeObjectHelper::find((string *)local_198,SUB81(local_60,0));
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_140._vptr_iterator != p_Var1) {
    operator_delete(local_140._vptr_iterator,
                    (ulong)((long)&(local_140.impl.
                                    super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFNameTreeObjectHelper::iterator::remove();
  pcVar5 = (char *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  iVar4 = std::__cxx11::string::compare(pcVar5);
  if (iVar4 != 0) {
    __assert_fail("iter1->first == \"1D\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa11,"void test_75(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::remove();
  QPDFNameTreeObjectHelper::end();
  cVar3 = QPDFNameTreeObjectHelper::iterator::operator==((iterator *)local_198,&local_140);
  if (cVar3 == '\0') {
    __assert_fail("iter1 == erase1.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa13,"void test_75(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_140);
  QPDFNameTreeObjectHelper::iterator::operator--((iterator *)local_198);
  pcVar5 = (char *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  iVar4 = std::__cxx11::string::compare(pcVar5);
  if (iVar4 != 0) {
    __assert_fail("iter1->first == \"1A\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa15,"void test_75(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::remove();
  QPDFNameTreeObjectHelper::end();
  cVar3 = QPDFNameTreeObjectHelper::iterator::operator==((iterator *)local_198,&local_140);
  if (cVar3 == '\0') {
    __assert_fail("iter1 == erase1.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa17,"void test_75(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_140);
  QPDF::getTrailer();
  local_140._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"/Erase2","");
  QPDFObjectHandle::getKey((string *)&local_150);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_140._vptr_iterator != p_Var1) {
    operator_delete(local_140._vptr_iterator,
                    (ulong)((long)&(local_140.impl.
                                    super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_260.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_260.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  local_b0 = local_150;
  local_a8 = local_148;
  if (local_148 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_148->_M_use_count = local_148->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_148->_M_use_count = local_148->_M_use_count + 1;
    }
  }
  QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_b0;
  QPDFNumberTreeObjectHelper::QPDFNumberTreeObjectHelper
            ((QPDFNumberTreeObjectHelper *)&local_140,QVar9,(QPDF *)0x1,(bool)in_R8B);
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  }
  QPDFNumberTreeObjectHelper::find((longlong)&local_e0,SUB81(&local_140,0));
  QPDFNumberTreeObjectHelper::iterator::remove();
  QPDFNumberTreeObjectHelper::end();
  cVar3 = QPDFNumberTreeObjectHelper::iterator::operator==(&local_e0,&local_260);
  if (cVar3 == '\0') {
    __assert_fail("iter2 == erase2.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa1d,"void test_75(QPDF &, const char *)");
  }
  QPDFNumberTreeObjectHelper::iterator::~iterator(&local_260);
  QPDFNumberTreeObjectHelper::iterator::operator--(&local_e0);
  plVar6 = (long *)QPDFNumberTreeObjectHelper::iterator::operator->(&local_e0);
  if (*plVar6 != 0xf0) {
    __assert_fail("iter2->first == 240",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa1f,"void test_75(QPDF &, const char *)");
  }
  p_Var1 = &local_260.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  local_260._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"/Kids","");
  QPDFObjectHandle::getKey((string *)&local_228);
  QPDFObjectHandle::getArrayItem((int)&local_1e8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_228.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_228.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_260._vptr_iterator != p_Var1) {
    operator_delete(local_260._vptr_iterator,
                    (ulong)((long)&(local_260.impl.
                                    super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_260._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"/Limits","");
  QPDFObjectHandle::getKey((string *)&local_1a8);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_260._vptr_iterator != p_Var1) {
    operator_delete(local_260._vptr_iterator,
                    (ulong)((long)&(local_260.impl.
                                    super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::getArrayItem((int)&local_260);
  lVar7 = QPDFObjectHandle::getIntValue();
  if (lVar7 != 0xe6) {
    __assert_fail("l1.getArrayItem(0).getIntValue() == 230",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa22,"void test_75(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_260.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_260.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  QPDFObjectHandle::getArrayItem((int)&local_260);
  lVar7 = QPDFObjectHandle::getIntValue();
  if (lVar7 != 0xf0) {
    __assert_fail("l1.getArrayItem(1).getIntValue() == 240",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa23,"void test_75(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_260.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_260.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  QPDFNumberTreeObjectHelper::find((longlong)&local_260,SUB81(&local_140,0));
  p_Var1 = &local_260.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  this = &local_e0.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_e0.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_260.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(this,p_Var1);
  local_e0.ivalue.first = local_260.ivalue.first;
  local_e0.ivalue.second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_260.ivalue.second.super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            ((long)&local_e0.ivalue.second.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> + 8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&local_260.ivalue.second.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> + 8));
  QPDFNumberTreeObjectHelper::iterator::~iterator(&local_260);
  QPDFNumberTreeObjectHelper::iterator::remove();
  plVar6 = (long *)QPDFNumberTreeObjectHelper::iterator::operator->(&local_e0);
  if (*plVar6 != 0xdc) {
    __assert_fail("iter2->first == 220",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa26,"void test_75(QPDF &, const char *)");
  }
  local_260._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"/Kids","");
  QPDFObjectHandle::getKey((string *)&local_1d8);
  QPDFObjectHandle::getArrayItem((int)&local_228);
  p_Var2 = p_Stack_1e0;
  p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_228.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_1e8 = local_228._vptr_iterator;
  local_228._vptr_iterator = (_func_int **)0x0;
  local_228.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_228.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_228.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_1d8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_1d8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_260._vptr_iterator != p_Var1) {
    operator_delete(local_260._vptr_iterator,
                    (ulong)((long)&(local_260.impl.
                                    super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_260._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"/Limits","");
  QPDFObjectHandle::getKey((string *)&local_228);
  p_Var2 = p_Stack_1a0;
  p_Stack_1a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_228.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_1a8 = local_228._vptr_iterator;
  local_228._vptr_iterator = (_func_int **)0x0;
  local_228.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_228.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_228.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_260._vptr_iterator != p_Var1) {
    operator_delete(local_260._vptr_iterator,
                    (ulong)((long)&(local_260.impl.
                                    super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::getArrayItem((int)&local_260);
  lVar7 = QPDFObjectHandle::getIntValue();
  if (lVar7 != 0xdc) {
    __assert_fail("l1.getArrayItem(0).getIntValue() == 220",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa29,"void test_75(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_260.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_260.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  QPDFObjectHandle::getArrayItem((int)&local_260);
  lVar7 = QPDFObjectHandle::getIntValue();
  if (lVar7 != 0xdc) {
    __assert_fail("l1.getArrayItem(1).getIntValue() == 220",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa2a,"void test_75(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_260.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_260.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  local_260._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"/Kids","");
  QPDFObjectHandle::getKey((string *)&local_228);
  p_Var2 = p_Stack_1e0;
  p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_228.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_1e8 = local_228._vptr_iterator;
  local_228._vptr_iterator = (_func_int **)0x0;
  local_228.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_228.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_228.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_260._vptr_iterator != p_Var1) {
    operator_delete(local_260._vptr_iterator,
                    (ulong)((long)&(local_260.impl.
                                    super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  iVar4 = QPDFObjectHandle::getArrayNItems();
  if (iVar4 != 1) {
    __assert_fail("k1.getArrayNItems() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa2c,"void test_75(QPDF &, const char *)");
  }
  QPDF::getTrailer();
  p_Var1 = &local_228.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  local_228._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"/Erase3","");
  QPDFObjectHandle::getKey(local_80);
  QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_80;
  QPDFNumberTreeObjectHelper::QPDFNumberTreeObjectHelper
            ((QPDFNumberTreeObjectHelper *)&local_260,QVar10,(QPDF *)0x1,(bool)in_R8B);
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_228._vptr_iterator != p_Var1) {
    operator_delete(local_228._vptr_iterator,
                    (ulong)((long)&(local_228.impl.
                                    super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_1d8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_1d8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  QPDFNumberTreeObjectHelper::find((longlong)&local_228,SUB81(&local_260,0));
  local_e0.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_228.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (this,&local_228.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount);
  local_e0.ivalue.first = local_228.ivalue.first;
  local_e0.ivalue.second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_228.ivalue.second.super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&local_228.ivalue.second.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> + 8));
  QPDFNumberTreeObjectHelper::iterator::~iterator(&local_228);
  QPDFNumberTreeObjectHelper::iterator::remove();
  QPDFNumberTreeObjectHelper::end();
  cVar3 = QPDFNumberTreeObjectHelper::iterator::operator==(&local_e0,&local_228);
  if (cVar3 == '\0') {
    __assert_fail("iter2 == erase3.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa31,"void test_75(QPDF &, const char *)");
  }
  QPDFNumberTreeObjectHelper::iterator::~iterator(&local_228);
  QPDFNumberTreeObjectHelper::remove((longlong)&local_260,(QPDFObjectHandle *)0x136);
  QPDFNumberTreeObjectHelper::begin();
  QPDFNumberTreeObjectHelper::end();
  cVar3 = QPDFNumberTreeObjectHelper::iterator::operator==(&local_228,&local_1d8);
  if (cVar3 == '\0') {
    __assert_fail("erase3.begin() == erase3.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa33,"void test_75(QPDF &, const char *)");
  }
  QPDFNumberTreeObjectHelper::iterator::~iterator(&local_1d8);
  QPDFNumberTreeObjectHelper::iterator::~iterator(&local_228);
  QPDF::getTrailer();
  p_Var1 = &local_1d8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  local_1d8._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"/Erase4","");
  QPDFObjectHandle::getKey(local_90);
  QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_90;
  QPDFNumberTreeObjectHelper::QPDFNumberTreeObjectHelper
            ((QPDFNumberTreeObjectHelper *)&local_228,QVar11,(QPDF *)0x1,(bool)in_R8B);
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1d8._vptr_iterator != p_Var1) {
    operator_delete(local_1d8._vptr_iterator,
                    (ulong)((long)&(local_1d8.impl.
                                    super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  QPDFNumberTreeObjectHelper::find((longlong)&local_1d8,SUB81(&local_228,0));
  local_e0.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_1d8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (this,&local_1d8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount);
  local_e0.ivalue.first = local_1d8.ivalue.first;
  local_e0.ivalue.second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_1d8.ivalue.second.super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&local_1d8.ivalue.second.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> + 8));
  QPDFNumberTreeObjectHelper::iterator::~iterator(&local_1d8);
  QPDFNumberTreeObjectHelper::iterator::remove();
  plVar6 = (long *)QPDFNumberTreeObjectHelper::iterator::operator->(&local_e0);
  if (*plVar6 == 0x1ae) {
    QPDFWriter::QPDFWriter((QPDFWriter *)&local_1d8,pdf,"a.pdf");
    QPDFWriter::setStaticID(SUB81(&local_1d8,0));
    QPDFWriter::setQDFMode(SUB81(&local_1d8,0));
    QPDFWriter::write();
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_1d8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_1d8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    QPDFNumberTreeObjectHelper::~QPDFNumberTreeObjectHelper
              ((QPDFNumberTreeObjectHelper *)&local_228);
    QPDFNumberTreeObjectHelper::~QPDFNumberTreeObjectHelper
              ((QPDFNumberTreeObjectHelper *)&local_260);
    if (p_Stack_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1a0);
    }
    if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
    }
    QPDFNumberTreeObjectHelper::iterator::~iterator(&local_e0);
    QPDFNumberTreeObjectHelper::~QPDFNumberTreeObjectHelper
              ((QPDFNumberTreeObjectHelper *)&local_140);
    if (local_148 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_148);
    }
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_198);
    if (p_Stack_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_f0);
    }
    QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(local_60);
    return;
  }
  __assert_fail("iter2->first == 430",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0xa38,"void test_75(QPDF &, const char *)");
}

Assistant:

static void
test_75(QPDF& pdf, char const* arg2)
{
    // This test is crafted to work with erase-nntree.pdf
    auto erase1 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Erase1"), pdf);
    QPDFObjectHandle value;
    assert(!erase1.remove("1X"));
    assert(erase1.remove("1C", &value));
    assert(value.getUTF8Value() == "c");
    auto iter1 = erase1.find("1B");
    iter1.remove();
    assert(iter1->first == "1D");
    iter1.remove();
    assert(iter1 == erase1.end());
    --iter1;
    assert(iter1->first == "1A");
    iter1.remove();
    assert(iter1 == erase1.end());

    auto erase2_oh = pdf.getTrailer().getKey("/Erase2");
    auto erase2 = QPDFNumberTreeObjectHelper(erase2_oh, pdf);
    auto iter2 = erase2.find(250);
    iter2.remove();
    assert(iter2 == erase2.end());
    --iter2;
    assert(iter2->first == 240);
    auto k1 = erase2_oh.getKey("/Kids").getArrayItem(1);
    auto l1 = k1.getKey("/Limits");
    assert(l1.getArrayItem(0).getIntValue() == 230);
    assert(l1.getArrayItem(1).getIntValue() == 240);
    iter2 = erase2.find(210);
    iter2.remove();
    assert(iter2->first == 220);
    k1 = erase2_oh.getKey("/Kids").getArrayItem(0);
    l1 = k1.getKey("/Limits");
    assert(l1.getArrayItem(0).getIntValue() == 220);
    assert(l1.getArrayItem(1).getIntValue() == 220);
    k1 = k1.getKey("/Kids");
    assert(k1.getArrayNItems() == 1);

    auto erase3 = QPDFNumberTreeObjectHelper(pdf.getTrailer().getKey("/Erase3"), pdf);
    iter2 = erase3.find(320);
    iter2.remove();
    assert(iter2 == erase3.end());
    erase3.remove(310);
    assert(erase3.begin() == erase3.end());

    auto erase4 = QPDFNumberTreeObjectHelper(pdf.getTrailer().getKey("/Erase4"), pdf);
    iter2 = erase4.find(420);
    iter2.remove();
    assert(iter2->first == 430);

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setQDFMode(true);
    w.write();
}